

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.c
# Opt level: O0

int mixed_make_segment_info(char *name,uint32_t *argc,mixed_segment_field_info **args)

{
  int iVar1;
  ulong uVar2;
  segment_entry *entry;
  uint32_t i;
  mixed_segment_field_info **args_local;
  uint32_t *argc_local;
  char *name_local;
  
  entry._4_4_ = 0;
  while( true ) {
    if (segments.count <= entry._4_4_) {
      mixed_err(0x18);
      return 0;
    }
    uVar2 = (ulong)entry._4_4_;
    if ((segments.entries[uVar2].function != (mixed_make_segment_function)0x0) &&
       (iVar1 = strcmp(segments.entries[uVar2].name,name), iVar1 == 0)) break;
    entry._4_4_ = entry._4_4_ + 1;
  }
  *argc = segments.entries[uVar2].argc;
  *args = segments.entries[uVar2].args;
  return 1;
}

Assistant:

MIXED_EXPORT int mixed_make_segment_info(const char *name, uint32_t *argc, const struct mixed_segment_field_info **args){
  for(uint32_t i=0; i<segments.count; ++i){
    struct segment_entry *entry = &segments.entries[i];
    if(entry->function && strcmp(entry->name, name) == 0){
      *argc = entry->argc;
      *args = entry->args;
      return 1;
    }
  }
  mixed_err(MIXED_BAD_SEGMENT);
  return 0;
}